

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<char>_> *
kj::parse::Times_<const_kj::parse::Any__&>::Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>
::apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,uint count,
       IteratorInput<char,_const_char_*> *input)

{
  char *firstElement;
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong capacity;
  
  capacity = (ulong)count;
  firstElement = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                   (1,0,capacity,(_func_void_void_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
  sVar4 = 0;
  if (count != 0) {
    pcVar3 = firstElement + capacity;
    uVar2 = 0;
    do {
      pcVar1 = input->pos;
      if (pcVar1 == input->end) {
        (__return_storage_ptr__->ptr).isSet = false;
        pcVar1 = firstElement + uVar2;
        goto LAB_0025daca;
      }
      input->pos = pcVar1 + 1;
      firstElement[uVar2] = *pcVar1;
      uVar2 = uVar2 + 1;
      sVar4 = capacity;
    } while (uVar2 < capacity);
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = firstElement;
  (__return_storage_ptr__->ptr).field_1.value.size_ = sVar4;
  (__return_storage_ptr__->ptr).field_1.value.disposer =
       (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pcVar1 = (char *)0x0;
  firstElement = (char *)0x0;
  pcVar3 = (char *)0x0;
LAB_0025daca:
  if (firstElement != (char *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,1,
               (long)pcVar1 - (long)firstElement,(long)pcVar3 - (long)firstElement,
               (_func_void_void_ptr *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, uint count, Input& input) {
    auto results = heapArrayBuilder<OutputType<SubParser, Input>>(count);

    while (results.size() < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        results.add(kj::mv(*subResult));
      } else {
        return nullptr;
      }
    }

    return results.finish();
  }